

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

int tchecker::lexical_cmp(clock_reset_t *r1,clock_reset_t *r2)

{
  clock_id_t cVar1;
  clock_id_t cVar2;
  integer_t iVar3;
  integer_t iVar4;
  undefined4 local_38;
  clock_reset_t *r2_local;
  clock_reset_t *r1_local;
  
  cVar1 = clock_reset_t::left_id(r1);
  cVar2 = clock_reset_t::left_id(r2);
  if (cVar1 == cVar2) {
    cVar1 = clock_reset_t::right_id(r1);
    cVar2 = clock_reset_t::right_id(r2);
    if (cVar1 == cVar2) {
      iVar3 = clock_reset_t::value(r1);
      iVar4 = clock_reset_t::value(r2);
      if (iVar3 == iVar4) {
        local_38 = 0;
      }
      else {
        iVar3 = clock_reset_t::value(r1);
        iVar4 = clock_reset_t::value(r2);
        local_38 = 1;
        if (iVar3 < iVar4) {
          local_38 = -1;
        }
      }
      r1_local._4_4_ = local_38;
    }
    else {
      cVar1 = clock_reset_t::right_id(r1);
      cVar2 = clock_reset_t::right_id(r2);
      r1_local._4_4_ = 1;
      if (cVar1 < cVar2) {
        r1_local._4_4_ = -1;
      }
    }
  }
  else {
    cVar1 = clock_reset_t::left_id(r1);
    cVar2 = clock_reset_t::left_id(r2);
    r1_local._4_4_ = 1;
    if (cVar1 < cVar2) {
      r1_local._4_4_ = -1;
    }
  }
  return r1_local._4_4_;
}

Assistant:

int lexical_cmp(tchecker::clock_reset_t const & r1, tchecker::clock_reset_t const & r2)
{
  if (r1.left_id() != r2.left_id())
    return (r1.left_id() < r2.left_id() ? -1 : 1);
  if (r1.right_id() != r2.right_id())
    return (r1.right_id() < r2.right_id() ? -1 : 1);
  return (r1.value() == r2.value() ? 0 : (r1.value() < r2.value() ? -1 : 1));
}